

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_invalid_opc.cpp
# Opt level: O3

string * __thiscall
spvtools::opt::ReplaceInvalidOpcodePass::BuildWarningMessage_abi_cxx11_
          (string *__return_storage_ptr__,ReplaceInvalidOpcodePass *this,Op opcode)

{
  spv_opcode_desc opcode_info;
  spv_opcode_desc local_18;
  
  AssemblyGrammar::lookupOpcode(&((this->super_Pass).context_)->grammar_,opcode,&local_18);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"Removing ","");
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string ReplaceInvalidOpcodePass::BuildWarningMessage(spv::Op opcode) {
  spv_opcode_desc opcode_info;
  context()->grammar().lookupOpcode(opcode, &opcode_info);
  std::string message = "Removing ";
  message += opcode_info->name;
  message += " instruction because of incompatible execution model.";
  return message;
}